

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlCtxtReadFd(htmlParserCtxtPtr ctxt,int fd,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr input_00;
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  xmlParserInputBufferPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int fd_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (fd < 0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    xmlInitParser();
    htmlCtxtReset(ctxt);
    input_00 = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (input_00 == (xmlParserInputBufferPtr)0x0) {
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      value = xmlNewIOInputStream(ctxt,input_00,XML_CHAR_ENCODING_NONE);
      if (value == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(input_00);
        ctxt_local = (htmlParserCtxtPtr)0x0;
      }
      else {
        inputPush(ctxt,value);
        ctxt_local = (htmlParserCtxtPtr)htmlDoRead(ctxt,URL,encoding,options,1);
      }
    }
  }
  return (htmlDocPtr)ctxt_local;
}

Assistant:

htmlDocPtr
htmlCtxtReadFd(htmlParserCtxtPtr ctxt, int fd,
              const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (fd < 0)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    htmlCtxtReset(ctxt);


    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (NULL);
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 1));
}